

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O2

bool google::protobuf::compiler::js::anon_unknown_0::ReturnsNullWhenUnset
               (GeneratorOptions *options,FieldDescriptor *field)

{
  bool bVar1;
  CppType CVar2;
  
  CVar2 = FieldDescriptor::cpp_type((FieldDescriptor *)options);
  if ((CVar2 != CPPTYPE_MESSAGE) ||
     (bVar1 = true, *(int *)((long)&(options->namespace_prefix).field_2 + 0xc) != 1)) {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool ReturnsNullWhenUnset(const GeneratorOptions& options,
                          const FieldDescriptor* field) {
  if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE &&
      field->is_optional()) {
    return true;
  }

  // TODO(haberman): remove this case and unconditionally return false.
  return UseBrokenPresenceSemantics(options, field) && !field->is_repeated() &&
         !field->has_default_value();
}